

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opts.h
# Opt level: O0

bool opts::Converter<int>::convert(string *val,int *res)

{
  byte bVar1;
  int *in_RSI;
  undefined8 in_RDI;
  istringstream iss;
  byte local_1aa;
  istringstream local_190 [384];
  int *local_10;
  
  local_10 = in_RSI;
  std::__cxx11::istringstream::istringstream(local_190,in_RDI,8);
  std::istream::operator>>(local_190,local_10);
  bVar1 = std::ios::fail();
  local_1aa = 0;
  if ((bVar1 & 1) == 0) {
    local_1aa = std::ios::eof();
  }
  std::__cxx11::istringstream::~istringstream(local_190);
  return (bool)(local_1aa & 1);
}

Assistant:

static
    bool            convert(const std::string& val, T& res)
    {
        std::istringstream iss(val);
        iss >> res;
        return !iss.fail() && iss.eof();
    }